

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::update_lsd(session_impl *this)

{
  bool bVar1;
  session_impl *this_local;
  
  bVar1 = session_settings::get_bool(&this->m_settings,0x803d);
  if (bVar1) {
    start_lsd(this);
  }
  else {
    stop_lsd(this);
  }
  return;
}

Assistant:

void session_impl::update_lsd()
	{
		if (m_settings.get_bool(settings_pack::enable_lsd))
			start_lsd();
		else
			stop_lsd();
	}